

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBString *b,uchar splitChar)

{
  uchar uVar1;
  int iVar2;
  int i;
  CBString local_48;
  
  iVar2 = 0;
  do {
    i = iVar2;
    if (iVar2 < (b->super_tagbstring).slen) {
      do {
        uVar1 = CBString::character(b,i);
        if (uVar1 == splitChar) break;
        i = i + 1;
      } while (i < (b->super_tagbstring).slen);
    }
    if (iVar2 <= i) {
      CBString::CBString(&local_48,(b->super_tagbstring).data + iVar2,i - iVar2);
      std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
      emplace_back<Bstrlib::CBString>
                ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_48);
      local_48._vptr_CBString = (_func_int **)&PTR__CBString_00184840;
      if (local_48.super_tagbstring.data != (uchar *)0x0) {
        free(local_48.super_tagbstring.data);
        local_48.super_tagbstring.data = (uchar *)0x0;
      }
    }
    iVar2 = i + 1;
    if ((b->super_tagbstring).slen <= i) {
      return;
    }
  } while( true );
}

Assistant:

void CBStringList::split (const CBString& b, unsigned char splitChar) {
int p, i;

	p = 0;
	do {
		for (i = p; i < b.length (); i++) {
			if (b.character (i) == splitChar) break;
		}
		if (i >= p) this->push_back (CBString (&(b.data[p]), i - p));
		p = i + 1;
	} while (p <= b.length ());
}